

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_PtrNoConNoDecon_Test::TestBody(Arena_PtrNoConNoDecon_Test *this)

{
  char *message;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr2;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr3;
  string local_a0;
  AssertionResult gtest_ar_;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr4;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  Arena arena;
  AssertionResult gtest_ar__2;
  
  memt::Arena::Arena(&arena);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       arena._blocks._block._begin == arena._blocks._block._position &&
       arena._blocks._block._previous == (Block *)0x0;
  if (arena._blocks._block._begin == arena._blocks._block._position &&
      arena._blocks._block._previous == (Block *)0x0) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_._0_8_ = &arena;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )memt::Arena::alloc(&arena,8);
    ptr2.mPtr = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)0x0;
    ptr2.mArena = (Arena *)CONCAT71(ptr2.mArena._1_7_,
                                    arena._blocks._block._begin != arena._blocks._block._position ||
                                    arena._blocks._block._previous != (Block *)0x0);
    if (arena._blocks._block._begin == arena._blocks._block._position &&
        arena._blocks._block._previous == (Block *)0x0) {
      testing::Message::Message((Message *)&ptr3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)&ptr2,(AssertionResult *)"arena.isEmpty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd3,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr4,(Message *)&ptr3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr4);
      std::__cxx11::string::~string((string *)&local_a0);
      if (ptr3.mArena != (Arena *)0x0) {
        (**(code **)(((ptr3.mArena)->_blocks)._block._begin + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ptr2.mPtr);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ptr2.mPtr);
      ptr2.mArena = &arena;
      ptr2.mPtr = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                  memt::Arena::alloc(&arena,8);
      ptr3.mArena = &arena;
      ptr3.mPtr = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                  memt::Arena::alloc(&arena,8);
      ptr4.mArena = &arena;
      ptr4.mPtr = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                  memt::Arena::alloc(&arena,8);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ =
           arena._blocks._block._begin != arena._blocks._block._position ||
           arena._blocks._block._previous != (Block *)0x0;
      if (arena._blocks._block._begin != arena._blocks._block._position ||
          arena._blocks._block._previous != (Block *)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon(&ptr4);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon(&ptr3);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon(&ptr2);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)&gtest_ar_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             arena._blocks._block._begin == arena._blocks._block._position &&
             arena._blocks._block._previous == (Block *)0x0;
        if (arena._blocks._block._begin != arena._blocks._block._position ||
            arena._blocks._block._previous != (Block *)0x0) {
          testing::Message::Message((Message *)&ptr2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,(internal *)&gtest_ar_,(AssertionResult *)"arena.isEmpty()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ptr3,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xd9,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&ptr3,(Message *)&ptr2);
          goto LAB_0010e932;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::__cxx11::stringbuf::str();
        std::ios::clear((int)*(undefined8 *)
                              ((anonymous_namespace)::
                               _frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,0ul>
                               ::_log_abi_cxx11_ + -0x18) + 0x151c28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"",(allocator<char> *)&ptr3);
        std::__cxx11::stringbuf::str((string *)&DAT_00151c30);
        std::__cxx11::string::~string((string *)&local_a0);
        message = "";
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
                  ((internal *)&ptr2,"PtrNoConNoDeconHelper::resetLog()","\"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                   (char (*) [1])0x136837);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((char)ptr2.mArena == '\0') {
          testing::Message::Message((Message *)&local_a0);
          if (ptr2.mPtr !=
              (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)0x0) {
            message = *(char **)ptr2.mPtr;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xda,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
          }
        }
        this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ptr2.mPtr;
        goto LAB_0010e959;
      }
      testing::Message::Message((Message *)&local_48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)&gtest_ar__2,(AssertionResult *)"arena.isEmpty()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd7,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      std::__cxx11::string::~string((string *)&local_a0);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon(&ptr4);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon(&ptr3);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon(&ptr2);
    }
    memt::Arena::
    PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
    ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                        *)&gtest_ar_);
  }
  else {
    testing::Message::Message((Message *)&ptr2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&gtest_ar_,(AssertionResult *)"arena.isEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ptr3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xd0,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ptr3,(Message *)&ptr2);
LAB_0010e932:
    this_00 = &gtest_ar_.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr3);
    std::__cxx11::string::~string((string *)&local_a0);
    if (ptr2.mArena != (Arena *)0x0) {
      (**(code **)(((ptr2.mArena)->_blocks)._block._begin + 8))();
    }
LAB_0010e959:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
  }
  memt::Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, PtrNoConNoDecon) {
  memt::Arena arena;
  ASSERT_TRUE(arena.isEmpty());
  {
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr1(arena);
	ASSERT_FALSE(arena.isEmpty());
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr2(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr3(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr4(arena);
	ASSERT_FALSE(arena.isEmpty());
  }
  ASSERT_TRUE(arena.isEmpty());
  ASSERT_EQ(PtrNoConNoDeconHelper::resetLog(), "");
}